

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 __thiscall
unodb::detail::olc_impl_helpers::
add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,value_view v,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          tree_depth<unodb::detail::basic_art_key<unsigned_long>_> depth,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,read_critical_section *parent_critical_section,
          olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  olc_impl_helpers children_count_;
  uintptr_t *puVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  uint uVar6;
  long *plVar7;
  write_guard wVar8;
  bool bVar9;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var10;
  uint uVar11;
  undefined7 in_register_00000011;
  __extent_storage<18446744073709551615UL> db_instance_00;
  undefined8 unaff_R13;
  ulong uVar12;
  optimistic_lock *poVar14;
  undefined1 auVar15 [16];
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar16;
  undefined4 in_stack_00000014;
  write_guard local_50;
  write_guard write_unlock_on_exit;
  write_guard local_40;
  write_guard write_unlock_on_exit_1;
  write_guard node_write_guard;
  undefined7 uVar13;
  
  db_instance_00 = v._M_extent._M_extent_value;
  auVar15[0] = SUB81(inode,0);
  auVar15[1] = auVar15[0];
  auVar15[2] = auVar15[0];
  auVar15[3] = auVar15[0];
  auVar15[4] = auVar15[0];
  auVar15[5] = auVar15[0];
  auVar15[6] = auVar15[0];
  auVar15[7] = auVar15[0];
  auVar15[8] = auVar15[0];
  auVar15[9] = auVar15[0];
  auVar15[10] = auVar15[0];
  auVar15[0xb] = auVar15[0];
  auVar15[0xc] = auVar15[0];
  auVar15[0xd] = auVar15[0];
  auVar15[0xe] = auVar15[0];
  auVar15[0xf] = auVar15[0];
  auVar15 = vpcmpeqb_avx(auVar15,*(undefined1 (*) [16])(this + 0x30));
  uVar13 = (undefined7)((ulong)unaff_R13 >> 8);
  uVar12 = CONCAT71(uVar13,1);
  uVar11 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) &
           ~(-1 << ((byte)this[0x20] & 0x1f));
  if (uVar11 != 0) {
    uVar6 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    _Var10._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
         (this + (ulong)uVar6 * 8 + 0x40);
    goto LAB_0014a739;
  }
  plVar7 = (long *)CONCAT44(in_stack_00000014,depth.value);
  create_leaf_if_needed<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)parent_critical_section,
             (olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *)
             CONCAT71(in_register_00000011,key_byte),k,v,
             (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             db_instance_00._M_extent_value);
  children_count_ = this[0x20];
  if (children_count_ == (olc_impl_helpers)0x10) {
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
              ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                *)&stack0xffffffffffffffb0,(db_type *)db_instance_00._M_extent_value,
               (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               this);
    bVar9 = optimistic_lock::try_upgrade_to_write_lock
                      ((optimistic_lock *)(node_in_parent->value)._M_i.tagged_ptr,
                       (version_type)node_in_parent[1].value._M_i.tagged_ptr);
    local_40.lock = (optimistic_lock *)0x0;
    if (bVar9) {
      local_40.lock = (optimistic_lock *)(node_in_parent->value)._M_i.tagged_ptr;
    }
    (node_in_parent->value)._M_i.tagged_ptr = 0;
    if (local_40.lock == (optimistic_lock *)0x0) {
LAB_0014a895:
      optimistic_lock::write_guard::~write_guard(&local_40);
LAB_0014a89e:
      uVar12 = 0;
    }
    else {
      bVar9 = optimistic_lock::try_upgrade_to_write_lock
                        ((optimistic_lock *)*plVar7,(version_type)plVar7[1]);
      poVar14 = (optimistic_lock *)0x0;
      if (bVar9) {
        poVar14 = (optimistic_lock *)*plVar7;
      }
      *plVar7 = 0;
      write_unlock_on_exit_1.lock = poVar14;
      if (poVar14 == (optimistic_lock *)0x0) {
        optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
        goto LAB_0014a895;
      }
      olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::init
                ((olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                 )write_unlock_on_exit.lock,(EVP_PKEY_CTX *)db_instance_00._M_extent_value);
      wVar8 = write_unlock_on_exit;
      write_unlock_on_exit.lock = (optimistic_lock *)0x0;
      if (((ulong)wVar8.lock & 7) != 0) {
        __assert_fail("(result & ptr_bit_mask) == uintptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0x182,
                      "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                     );
      }
      node_critical_section->lock = wVar8.lock | 3;
      if (write_unlock_on_exit_1.lock != (optimistic_lock *)0x0) {
        __assert_fail("!node_write_guard.active()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x5b8,
                      "static std::optional<in_critical_section<olc_node_ptr> *> unodb::detail::olc_impl_helpers::add_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, value_view, olc_db<Key, Value> &, tree_depth<basic_art_key<Key>>, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, optimistic_lock::read_critical_section &, olc_db_leaf_unique_ptr<Key, Value> &) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                     );
      }
      optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
      optimistic_lock::write_guard::~write_guard(&local_40);
      if (poVar14 == (optimistic_lock *)0x0) goto LAB_0014a89e;
      LOCK();
      (((atomic<unsigned_long> *)(db_instance_00._M_extent_value + 0x210))->
      super___atomic_base<unsigned_long>)._M_i =
           (((atomic<unsigned_long> *)(db_instance_00._M_extent_value + 0x210))->
           super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      uVar12 = CONCAT71(uVar13,1);
    }
    std::
    unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&stack0xffffffffffffffb0);
  }
  else {
    bVar9 = optimistic_lock::try_upgrade_to_write_lock
                      ((optimistic_lock *)*plVar7,(version_type)plVar7[1]);
    local_50.lock = (optimistic_lock *)0x0;
    if (bVar9) {
      local_50.lock = (optimistic_lock *)*plVar7;
    }
    *plVar7 = 0;
    if (local_50.lock == (optimistic_lock *)0x0) {
LAB_0014a83b:
      optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffb0);
      _Var10._M_value =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           0x0;
      uVar12 = 0;
      goto LAB_0014a739;
    }
    puVar3 = (uintptr_t *)(node_in_parent->value)._M_i.tagged_ptr;
    uVar4 = node_in_parent[1].value._M_i.tagged_ptr;
    if ((long)puVar3[1] < 1) {
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    uVar5 = *puVar3;
    if (uVar4 != uVar5) {
      LOCK();
      puVar1 = puVar3 + 1;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if (SBORROW8(uVar2,1) != (long)*puVar1 < 0) goto LAB_0014a84e;
      if (uVar4 != uVar5) {
        (node_in_parent->value)._M_i.tagged_ptr = 0;
        goto LAB_0014a83b;
      }
    }
    LOCK();
    puVar3 = puVar3 + 1;
    uVar2 = *puVar3;
    *puVar3 = *puVar3 - 1;
    UNLOCK();
    if (SBORROW8(uVar2,1) != (long)*puVar3 < 0) {
LAB_0014a84e:
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
    (node_in_parent->value)._M_i.tagged_ptr = 0;
    if (uVar4 != uVar5) goto LAB_0014a83b;
    basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
    ::add_to_nonfull((basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      *)this,(db_leaf_unique_ptr *)parent_critical_section,db_instance._0_4_,
                     (uint8_t)children_count_);
    optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffb0);
  }
  _Var10._M_value =
       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0;
LAB_0014a739:
  oVar16.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_8_ = uVar12 & 0xffffffff;
  oVar16.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = _Var10._M_value;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar16.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}